

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
pstore::json::details::number_matcher<callbacks_proxy<mock_json_callbacks>_>::
do_integer_initial_digit_state
          (number_matcher<callbacks_proxy<mock_json_callbacks>_> *this,
          parser<callbacks_proxy<mock_json_callbacks>_> *parser,char c)

{
  bool bVar1;
  error_category *peVar2;
  int iVar3;
  error_code err;
  
  if ((this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_ != 3) {
    assert_failed("this->get_state () == integer_initial_digit_state",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x2c3);
  }
  if ((this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).field_0xd != '\0') {
    iVar3 = 5;
    if (c != '0') {
      if ((byte)(c - 0x31U) < 9) {
        if (this->int_acc_ != 0) {
          assert_failed("int_acc_ == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                        ,0x2c8);
        }
        this->int_acc_ = (ulong)(byte)(c - 0x30);
        iVar3 = 4;
      }
      else {
        peVar2 = get_error_category();
        err._M_cat = peVar2;
        err._0_8_ = 0xb;
        bVar1 = parser<callbacks_proxy<mock_json_callbacks>_>::set_error(parser,err);
        iVar3 = 1;
        if (!bVar1) {
          return true;
        }
      }
    }
    (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_ = iVar3;
    return true;
  }
  assert_failed("is_integer_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                ,0x2c4);
}

Assistant:

bool
            number_matcher<Callbacks>::do_integer_initial_digit_state (parser<Callbacks> & parser,
                                                                       char const c) {
                PSTORE_ASSERT (this->get_state () == integer_initial_digit_state);
                PSTORE_ASSERT (is_integer_);
                if (c == '0') {
                    this->set_state (frac_state);
                } else if (c >= '1' && c <= '9') {
                    PSTORE_ASSERT (int_acc_ == 0);
                    int_acc_ = static_cast<unsigned> (c - '0');
                    this->set_state (integer_digit_state);
                } else {
                    this->set_error (parser, error_code::unrecognized_token);
                }
                return true;
            }